

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,Path *value)

{
  Path local_118;
  undefined4 local_44;
  undefined1 local_40 [8];
  string str;
  Path *value_local;
  AsciiParser *this_local;
  
  if (value == (Path *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    str.field_2._8_8_ = value;
    ::std::__cxx11::string::string((string *)local_40);
    this_local._7_1_ = ReadPathIdentifier(this,(string *)local_40);
    if (this_local._7_1_) {
      pathutil::FromString(&local_118,(string *)local_40);
      Path::operator=((Path *)str.field_2._8_8_,&local_118);
      Path::~Path(&local_118);
    }
    local_44 = 1;
    ::std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(Path *value) {
  if (value) {
    std::string str;
    if (!ReadPathIdentifier(&str)) {
      return false;
    }

    (*value) = pathutil::FromString(str);

    return true;
  } else {
    return false;
  }
}